

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::BindSampler(GLContextState *this,Uint32 Index,GLSamplerObj *GLSampler)

{
  bool bVar1;
  size_type sVar2;
  reference CurrentObjectID;
  Char *Message;
  undefined1 local_50 [8];
  string msg;
  GLuint local_28;
  GLenum err;
  GLuint GLSamplerHandle;
  GLSamplerObj *GLSampler_local;
  GLContextState *pGStack_10;
  Uint32 Index_local;
  GLContextState *this_local;
  
  _GLSamplerHandle = GLSampler;
  GLSampler_local._4_4_ = Index;
  pGStack_10 = this;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->m_BoundSamplers);
  if (sVar2 <= Index) {
    err = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_BoundSamplers,(ulong)GLSampler_local._4_4_ + 1,(value_type_conflict5 *)&err)
    ;
  }
  local_28 = 0;
  CurrentObjectID =
       std::vector<int,_std::allocator<int>_>::operator[]
                 (&this->m_BoundSamplers,(ulong)GLSampler_local._4_4_);
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper>>
                    (CurrentObjectID,_GLSamplerHandle,&local_28);
  if (bVar1) {
    (*__glewBindSampler)(GLSampler_local._4_4_,local_28);
    msg.field_2._12_4_ = glGetError();
    if (msg.field_2._12_4_ != 0) {
      LogError<false,char[32],unsigned_int,char[17],unsigned_int>
                (false,"BindSampler",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x103,(char (*) [32])"Failed to bind sampler to slot ",
                 (uint *)((long)&GLSampler_local + 4),(char (*) [17])"\nGL Error Code: ",
                 (uint *)(msg.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_50,(char (*) [6])0xe8e72e);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"BindSampler",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x103);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void GLContextState::BindSampler(Uint32 Index, const GLObjectWrappers::GLSamplerObj& GLSampler)
{
    if (static_cast<size_t>(Index) >= m_BoundSamplers.size())
        m_BoundSamplers.resize(size_t{Index} + 1, -1);

    GLuint GLSamplerHandle = 0;
    if (UpdateBoundObject(m_BoundSamplers[Index], GLSampler, GLSamplerHandle))
    {
        glBindSampler(Index, GLSamplerHandle);
        DEV_CHECK_GL_ERROR("Failed to bind sampler to slot ", Index);
    }
}